

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O0

bool __thiscall FIX::TimeRange::isInRange(TimeRange *this,DateTime *dateTime,int day)

{
  int day_local;
  DateTime *dateTime_local;
  TimeRange *this_local;
  
  if ((*(int *)(this + 0x30) < 0) && (*(int *)(this + 0x34) < 0)) {
    this_local._7_1_ = isInRange((UtcTimeOnly *)this,(UtcTimeOnly *)(this + 0x18),dateTime);
  }
  else {
    this_local._7_1_ =
         isInRange((UtcTimeOnly *)this,(UtcTimeOnly *)(this + 0x18),*(int *)(this + 0x30),
                   *(int *)(this + 0x34),dateTime,day);
  }
  return this_local._7_1_;
}

Assistant:

bool isInRange(const DateTime &dateTime, int day) {
    if (m_startDay < 0 && m_endDay < 0) {
      return isInRange(m_startTime, m_endTime, dateTime);
    } else {
      return isInRange(m_startTime, m_endTime, m_startDay, m_endDay, dateTime, day);
    }
  }